

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::CollapsingHeader(char *label,bool *p_visible,ImGuiTreeNodeFlags flags)

{
  float fVar1;
  float fVar2;
  ImGuiWindow *this;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  ImVec2 IVar7;
  ImVec2 IVar8;
  ImGuiID IVar9;
  ImGuiItemFlags IVar10;
  ImGuiContext *pIVar11;
  ImGuiItemStatusFlags IVar12;
  float fVar13;
  bool bVar14;
  bool bVar15;
  ImGuiID IVar16;
  uint uVar17;
  float fVar18;
  ImGuiLastItemData last_item_backup;
  float local_5c;
  float fStack_58;
  ImVec2 local_38;
  
  this = GImGui->CurrentWindow;
  this->WriteAccessed = true;
  if (this->SkipItems == false) {
    if (p_visible == (bool *)0x0) {
      uVar17 = 0x1a;
    }
    else {
      uVar17 = 0x10001e;
      if (*p_visible != true) goto LAB_001acb8b;
    }
    IVar16 = ImGuiWindow::GetID(this,label,(char *)0x0);
    bVar14 = TreeNodeBehavior(IVar16,uVar17 | flags,label,(char *)0x0);
    pIVar11 = GImGui;
    if (p_visible != (bool *)0x0) {
      IVar9 = (GImGui->LastItemData).ID;
      IVar10 = (GImGui->LastItemData).InFlags;
      IVar12 = (GImGui->LastItemData).StatusFlags;
      fVar13 = (GImGui->LastItemData).Rect.Min.x;
      uVar3 = *(undefined8 *)&(GImGui->LastItemData).Rect.Min.y;
      uVar4 = *(undefined8 *)&(GImGui->LastItemData).Rect.Max.y;
      uVar5 = *(undefined8 *)&(GImGui->LastItemData).NavRect.Min.y;
      uVar6 = *(undefined8 *)&(GImGui->LastItemData).NavRect.Max.y;
      IVar7 = (GImGui->LastItemData).DisplayRect.Max;
      fStack_58 = (GImGui->LastItemData).DisplayRect.Min.y;
      local_5c = (float)((ulong)uVar6 >> 0x20);
      fVar1 = (GImGui->Style).FramePadding.x;
      fVar18 = ((GImGui->LastItemData).Rect.Max.x - (fVar1 + fVar1)) - GImGui->FontSize;
      fVar1 = (GImGui->LastItemData).Rect.Min.x;
      uVar17 = -(uint)(fVar18 <= fVar1);
      fVar2 = (GImGui->LastItemData).Rect.Min.y;
      IVar16 = GetIDWithSeed("#CLOSE",(char *)0x0,IVar16);
      local_38.x = (float)(uVar17 & (uint)fVar1 | ~uVar17 & (uint)fVar18);
      local_38.y = fVar2;
      bVar15 = CloseButton(IVar16,&local_38);
      if (bVar15) {
        *p_visible = false;
      }
      IVar8.y = fStack_58;
      IVar8.x = local_5c;
      (pIVar11->LastItemData).DisplayRect.Min = IVar8;
      (pIVar11->LastItemData).DisplayRect.Max = IVar7;
      *(undefined8 *)&(pIVar11->LastItemData).NavRect.Min.y = uVar5;
      *(undefined8 *)&(pIVar11->LastItemData).NavRect.Max.y = uVar6;
      *(undefined8 *)&(pIVar11->LastItemData).Rect.Min.y = uVar3;
      *(undefined8 *)&(pIVar11->LastItemData).Rect.Max.y = uVar4;
      (pIVar11->LastItemData).ID = IVar9;
      (pIVar11->LastItemData).InFlags = IVar10;
      (pIVar11->LastItemData).StatusFlags = IVar12;
      (pIVar11->LastItemData).Rect.Min.x = fVar13;
    }
  }
  else {
LAB_001acb8b:
    bVar14 = false;
  }
  return bVar14;
}

Assistant:

bool ImGui::CollapsingHeader(const char* label, bool* p_visible, ImGuiTreeNodeFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    if (p_visible && !*p_visible)
        return false;

    ImGuiID id = window->GetID(label);
    flags |= ImGuiTreeNodeFlags_CollapsingHeader;
    if (p_visible)
        flags |= ImGuiTreeNodeFlags_AllowItemOverlap | ImGuiTreeNodeFlags_ClipLabelForTrailingButton;
    bool is_open = TreeNodeBehavior(id, flags, label);
    if (p_visible != NULL)
    {
        // Create a small overlapping close button
        // FIXME: We can evolve this into user accessible helpers to add extra buttons on title bars, headers, etc.
        // FIXME: CloseButton can overlap into text, need find a way to clip the text somehow.
        ImGuiContext& g = *GImGui;
        ImGuiLastItemData last_item_backup = g.LastItemData;
        float button_size = g.FontSize;
        float button_x = ImMax(g.LastItemData.Rect.Min.x, g.LastItemData.Rect.Max.x - g.Style.FramePadding.x * 2.0f - button_size);
        float button_y = g.LastItemData.Rect.Min.y;
        ImGuiID close_button_id = GetIDWithSeed("#CLOSE", NULL, id);
        if (CloseButton(close_button_id, ImVec2(button_x, button_y)))
            *p_visible = false;
        g.LastItemData = last_item_backup;
    }

    return is_open;
}